

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleTypePrototypes(ExpressionTranslateContext *ctx)

{
  TypeBase *node;
  uint uVar1;
  TypeBase **ppTVar2;
  TypeStruct *type_00;
  TypeClass *pTVar3;
  TypeArray *pTVar4;
  TypeArray *typeArray;
  TypeClass *typeClass;
  TypeStruct *typeStruct;
  TypeBase *type;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Type prototypes");
  for (type._4_4_ = 0; uVar1 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types),
      type._4_4_ < uVar1; type._4_4_ = type._4_4_ + 1) {
    ppTVar2 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,type._4_4_);
    node = *ppTVar2;
    if ((node->isGeneric & 1U) == 0) {
      type_00 = getType<TypeStruct>(node);
      if (type_00 == (TypeStruct *)0x0) {
        pTVar4 = getType<TypeArray>(node);
        if (pTVar4 != (TypeArray *)0x0) {
          Print(ctx,"struct ");
          PrintEscapedName(ctx,(pTVar4->super_TypeBase).name);
          Print(ctx,";");
          PrintLine(ctx);
        }
      }
      else {
        pTVar3 = getType<TypeClass>(node);
        if (((pTVar3 == (TypeClass *)0x0) ||
            ((pTVar3->super_TypeStruct).super_TypeBase.importModule == (ModuleData *)0x0)) ||
           ((pTVar3->isInternal & 1U) == 0)) {
          Print(ctx,"struct ");
          PrintEscapedTypeName(ctx,&type_00->super_TypeBase);
          Print(ctx,";");
          PrintLine(ctx);
        }
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleTypePrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type prototypes");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->importModule && typeClass->isInternal)
					continue;
			}

			Print(ctx, "struct ");
			PrintEscapedTypeName(ctx, typeStruct);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "struct ");
			PrintEscapedName(ctx, typeArray->name);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}